

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

IVec4 __thiscall
vkt::pipeline::anon_unknown_0::getMaxImageSize
          (anon_unknown_0 *this,VkPhysicalDeviceLimits *limits,VkImageViewType viewType,
          IVec4 *sizeHint,bool useDepthStencil)

{
  int iVar1;
  int *piVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  IVec4 IVar4;
  deUint32 local_70;
  int local_68;
  deUint32 local_60;
  deUint32 local_58;
  deUint32 local_54;
  undefined1 local_40 [8];
  IVec4 size;
  int maxDepth;
  bool useDepthStencil_local;
  IVec4 *sizeHint_local;
  VkImageViewType viewType_local;
  VkPhysicalDeviceLimits *limits_local;
  
  size.m_data[3]._3_1_ = useDepthStencil;
  if (useDepthStencil) {
    local_54 = deMin32(limits->maxImageArrayLayers,limits->maxImageDimension3D);
  }
  else {
    local_54 = limits->maxImageDimension3D;
  }
  size.m_data[2] = local_54;
  iVar1 = tcu::Vector<int,_4>::x(sizeHint);
  if (iVar1 == -1) {
    local_58 = limits->maxFramebufferWidth;
  }
  else {
    local_58 = tcu::Vector<int,_4>::x(sizeHint);
  }
  iVar1 = tcu::Vector<int,_4>::y(sizeHint);
  if (iVar1 == -1) {
    local_60 = limits->maxFramebufferHeight;
  }
  else {
    local_60 = tcu::Vector<int,_4>::y(sizeHint);
  }
  iVar1 = tcu::Vector<int,_4>::z(sizeHint);
  if (iVar1 == -1) {
    local_68 = size.m_data[2];
  }
  else {
    local_68 = tcu::Vector<int,_4>::z(sizeHint);
  }
  iVar1 = tcu::Vector<int,_4>::w(sizeHint);
  if (iVar1 == -1) {
    local_70 = limits->maxImageArrayLayers;
  }
  else {
    local_70 = tcu::Vector<int,_4>::w(sizeHint);
  }
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_40,local_58,local_60,local_68,local_70);
  switch(viewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    iVar1 = deMin32(*piVar2,limits->maxImageDimension1D);
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    *piVar2 = iVar1;
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    iVar1 = deMin32(*piVar2,limits->maxImageDimension2D);
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    *piVar2 = iVar1;
    piVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_40);
    iVar1 = deMin32(*piVar2,limits->maxImageDimension2D);
    piVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_40);
    *piVar2 = iVar1;
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    iVar1 = deMin32(*piVar2,limits->maxImageDimension3D);
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    *piVar2 = iVar1;
    piVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_40);
    iVar1 = deMin32(*piVar2,limits->maxImageDimension3D);
    piVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_40);
    *piVar2 = iVar1;
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    iVar1 = deMin32(*piVar2,limits->maxImageDimensionCube);
    piVar2 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_40);
    *piVar2 = iVar1;
    piVar2 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_40);
    *piVar2 = iVar1;
    piVar2 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_40);
    iVar1 = *piVar2;
    piVar2 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_40);
    *piVar2 = (iVar1 / 6) * 6;
    break;
  default:
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this);
    uVar3 = extraout_RDX;
    goto LAB_00991091;
  }
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this,(Vector<int,_4> *)local_40);
  uVar3 = extraout_RDX_00;
LAB_00991091:
  IVar4.m_data[2] = (int)uVar3;
  IVar4.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  IVar4.m_data._0_8_ = this;
  return (IVec4)IVar4.m_data;
}

Assistant:

IVec4 getMaxImageSize (const VkPhysicalDeviceLimits& limits, const VkImageViewType viewType, const IVec4& sizeHint, const bool useDepthStencil)
{
	// If we use a layered D/S together with a 3D image, we have to use the smallest common limit
	const int maxDepth = (useDepthStencil ? deMin32(static_cast<int>(limits.maxImageArrayLayers), static_cast<int>(limits.maxImageDimension3D))
										  : static_cast<int>(limits.maxImageDimension3D));

	// Images have to respect framebuffer limits and image limits (the framebuffer is not layered in this case)
	IVec4 size = IVec4(
		sizeHint.x() != MAX_SIZE ? sizeHint.x() : static_cast<int>(limits.maxFramebufferWidth),
		sizeHint.y() != MAX_SIZE ? sizeHint.y() : static_cast<int>(limits.maxFramebufferHeight),
		sizeHint.z() != MAX_SIZE ? sizeHint.z() : maxDepth,
		sizeHint.w() != MAX_SIZE ? sizeHint.w() : static_cast<int>(limits.maxImageArrayLayers));

	switch (viewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			size.x() = deMin32(size.x(), limits.maxImageDimension1D);
			break;

		case VK_IMAGE_VIEW_TYPE_2D:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			size.x() = deMin32(size.x(), limits.maxImageDimension2D);
			size.y() = deMin32(size.y(), limits.maxImageDimension2D);
			break;

		case VK_IMAGE_VIEW_TYPE_3D:
			size.x() = deMin32(size.x(), limits.maxImageDimension3D);
			size.y() = deMin32(size.y(), limits.maxImageDimension3D);
			break;

		case VK_IMAGE_VIEW_TYPE_CUBE:
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			size.x() = size.y() = deMin32(size.x(), limits.maxImageDimensionCube);
			size.w() = NUM_CUBE_FACES * (size.w() / NUM_CUBE_FACES);	// round down to 6 faces
			break;

		default:
			DE_ASSERT(0);
			return IVec4();
	}

	return size;
}